

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,signed_char>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  data_t dVar1;
  
  dVar1 = Cast::Operation<unsigned_long,signed_char>(input);
  col->data[(this->chunk).count] = dVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}